

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

void __thiscall
slang::parsing::Preprocessor::Preprocessor
          (Preprocessor *this,SourceManager *sourceManager,BumpAllocator *alloc,
          Diagnostics *diagnostics,Bag *options_,
          span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>
          inheritedMacros)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  iterator __position;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  ulong uVar5;
  int iVar6;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *phVar7;
  bool bVar8;
  byte bVar9;
  uint uVar10;
  uint64_t hash;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong pos0;
  pointer ppDVar15;
  undefined1 auVar16 [16];
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  byte bVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  byte bVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  byte bVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  byte bVar32;
  initializer_list<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>
  il;
  try_emplace_args_t local_4d9;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_4d8;
  vector<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_> *local_4d0
  ;
  string_view name;
  DefineDirectiveSyntax *define;
  ulong local_4b0;
  uint64_t local_4a8;
  ulong local_4a0;
  ulong local_498;
  ulong local_490;
  NumberParser *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  LexerOptions *local_468;
  PreprocessorOptions *local_460;
  uchar local_458;
  uchar uStack_457;
  uchar uStack_456;
  byte bStack_455;
  uchar uStack_454;
  uchar uStack_453;
  uchar uStack_452;
  byte bStack_451;
  uchar uStack_450;
  uchar uStack_44f;
  uchar uStack_44e;
  byte bStack_44d;
  uchar uStack_44c;
  uchar uStack_44b;
  uchar uStack_44a;
  byte bStack_449;
  uchar local_448;
  uchar uStack_447;
  uchar uStack_446;
  byte bStack_445;
  uchar uStack_444;
  uchar uStack_443;
  uchar uStack_442;
  byte bStack_441;
  uchar uStack_440;
  uchar uStack_43f;
  uchar uStack_43e;
  byte bStack_43d;
  uchar uStack_43c;
  uchar uStack_43b;
  uchar uStack_43a;
  byte bStack_439;
  locator res;
  
  this->sourceManager = sourceManager;
  this->alloc = alloc;
  this->diagnostics = diagnostics;
  Bag::getOrDefault<slang::parsing::PreprocessorOptions>(&this->options,options_);
  local_468 = &this->lexerOptions;
  local_460 = &this->options;
  Bag::getOrDefault<slang::parsing::LexerOptions>(local_468,options_);
  (this->lexerStack).
  super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  .data_ = (pointer)(this->lexerStack).
                    super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                    .firstElement;
  (this->lexerStack).
  super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  .len = 0;
  (this->lexerStack).
  super_SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
  .cap = 2;
  local_470 = (this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.
              firstElement;
  (this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.data_ =
       (pointer)local_470;
  (this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.len = 0;
  (this->branchStack).super_SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>.cap = 2;
  (this->macros).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->macros).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
  .arrays.groups_size_mask = 1;
  (this->macros).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->macros).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->macros).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
  .size_ctrl.ml = 0;
  (this->macros).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
  .size_ctrl.size = 0;
  local_478 = (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.firstElement;
  (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.data_ = (pointer)local_478;
  (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.len = 0;
  (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.cap = 2;
  this->currentMacroToken = (Token *)0x0;
  Token::Token(&this->currentToken);
  Token::Token(&this->lastConsumed);
  this->inMacroBody = false;
  this->inIfDefCondition = false;
  local_480 = (this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.firstElement;
  (this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.data_ = (pointer)local_480
  ;
  (this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.len = 0;
  (this->scratchTokenBuffer).super_SmallVectorBase<slang::parsing::Token>.cap = 2;
  (this->includeOnceHeaders).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  .arrays.groups_size_index = 0x3f;
  (this->includeOnceHeaders).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  .arrays.groups_size_mask = 1;
  (this->includeOnceHeaders).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->includeOnceHeaders).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_4d0 = &this->keywordVersionStack;
  (this->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_engaged = false;
  (this->includeOnceHeaders).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  .size_ctrl.ml = 0;
  (this->includeOnceHeaders).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<const_char_*>,_slang::hash<const_char_*>,_std::equal_to<const_char_*>,_std::allocator<const_char_*>_>
  .size_ctrl.size = 0;
  (this->keywordVersionStack).
  super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->keywordVersionStack).
  super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->keywordVersionStack).
  super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->defaultNetType = WireKeyword;
  this->unconnectedDrive = Unknown;
  this->cellDefine = false;
  this->designElementDepth = 0;
  this->includeDepth = 0;
  this->protectEncryptDepth = 0;
  this->protectDecryptDepth = 0;
  this->protectLineLength = 0;
  this->protectBytes = 0;
  this->protectEncoding = Raw;
  local_488 = &this->numberParser;
  NumberParser::NumberParser(local_488,diagnostics,alloc,(this->options).languageVersion);
  (this->pragmaProtectHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->pragmaProtectHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  .arrays.groups_size_mask = 1;
  (this->pragmaProtectHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->pragmaProtectHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  (this->pragmaProtectHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  .size_ctrl.ml = 0;
  (this->pragmaProtectHandlers).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  .size_ctrl.size = 0;
  res.pg._0_1_ = LexerFacts::getDefaultKeywordVersion((this->options).languageVersion);
  __position._M_current =
       (this->keywordVersionStack).
       super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->keywordVersionStack).
      super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>::
    _M_realloc_insert<slang::parsing::KeywordVersion>(local_4d0,__position,(KeywordVersion *)&res);
  }
  else {
    *__position._M_current = (KeywordVersion)res.pg;
    (this->keywordVersionStack).
    super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
    ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  if ((this->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
      super__Optional_payload_base<slang::TimeScale>._M_engaged == true) {
    (this->activeTimeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
    super__Optional_payload_base<slang::TimeScale>._M_engaged = false;
  }
  this->defaultNetType = WireKeyword;
  this->unconnectedDrive = Unknown;
  this->cellDefine = false;
  resetProtectState(this);
  undefineAll(this);
  if (inheritedMacros._M_extent._M_extent_value != 0) {
    local_4d8 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)&this->macros;
    ppDVar15 = inheritedMacros._M_ptr + inheritedMacros._M_extent._M_extent_value;
    do {
      define = *inheritedMacros._M_ptr;
      name = Token::valueText(&define->name);
      phVar7 = local_4d8;
      if (name._M_len != 0) {
        hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                         (local_4d8,&name);
        uVar14 = hash >> ((byte)*phVar7 & 0x3f);
        lVar12 = (hash & 0xff) * 4;
        uVar17 = (&UNK_0092f4ac)[lVar12];
        uVar18 = (&UNK_0092f4ad)[lVar12];
        uVar19 = (&UNK_0092f4ae)[lVar12];
        bVar20 = (&UNK_0092f4af)[lVar12];
        uVar11 = (ulong)((uint)hash & 7);
        uVar13 = 0;
        pos0 = uVar14;
        uVar21 = uVar17;
        uVar22 = uVar18;
        uVar23 = uVar19;
        bVar24 = bVar20;
        uVar25 = uVar17;
        uVar26 = uVar18;
        uVar27 = uVar19;
        bVar28 = bVar20;
        uVar29 = uVar17;
        uVar30 = uVar18;
        uVar31 = uVar19;
        bVar32 = bVar20;
        do {
          pgVar3 = (this->macros).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                   .arrays.groups_;
          pgVar2 = pgVar3 + uVar14;
          local_448 = pgVar2->m[0].n;
          uStack_447 = pgVar2->m[1].n;
          uStack_446 = pgVar2->m[2].n;
          bStack_445 = pgVar2->m[3].n;
          uStack_444 = pgVar2->m[4].n;
          uStack_443 = pgVar2->m[5].n;
          uStack_442 = pgVar2->m[6].n;
          bStack_441 = pgVar2->m[7].n;
          uStack_440 = pgVar2->m[8].n;
          uStack_43f = pgVar2->m[9].n;
          uStack_43e = pgVar2->m[10].n;
          bStack_43d = pgVar2->m[0xb].n;
          uStack_43c = pgVar2->m[0xc].n;
          uStack_43b = pgVar2->m[0xd].n;
          uStack_43a = pgVar2->m[0xe].n;
          bVar9 = pgVar2->m[0xf].n;
          auVar16[0] = -(local_448 == uVar17);
          auVar16[1] = -(uStack_447 == uVar18);
          auVar16[2] = -(uStack_446 == uVar19);
          auVar16[3] = -(bStack_445 == bVar20);
          auVar16[4] = -(uStack_444 == uVar21);
          auVar16[5] = -(uStack_443 == uVar22);
          auVar16[6] = -(uStack_442 == uVar23);
          auVar16[7] = -(bStack_441 == bVar24);
          auVar16[8] = -(uStack_440 == uVar25);
          auVar16[9] = -(uStack_43f == uVar26);
          auVar16[10] = -(uStack_43e == uVar27);
          auVar16[0xb] = -(bStack_43d == bVar28);
          auVar16[0xc] = -(uStack_43c == uVar29);
          auVar16[0xd] = -(uStack_43b == uVar30);
          auVar16[0xe] = -(uStack_43a == uVar31);
          auVar16[0xf] = -(bVar9 == bVar32);
          uVar10 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe);
          bStack_439 = bVar9;
          if (uVar10 != 0) {
            ppVar4 = (this->macros).table_.
                     super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                     .arrays.elements_;
            local_4b0 = pos0;
            local_4a8 = hash;
            local_4a0 = uVar13;
            local_498 = uVar14;
            local_490 = uVar11;
            local_458 = uVar17;
            uStack_457 = uVar18;
            uStack_456 = uVar19;
            bStack_455 = bVar20;
            uStack_454 = uVar21;
            uStack_453 = uVar22;
            uStack_452 = uVar23;
            bStack_451 = bVar24;
            uStack_450 = uVar25;
            uStack_44f = uVar26;
            uStack_44e = uVar27;
            bStack_44d = bVar28;
            uStack_44c = uVar29;
            uStack_44b = uVar30;
            uStack_44a = uVar31;
            bStack_449 = bVar32;
            do {
              iVar6 = 0;
              if (uVar10 != 0) {
                for (; (uVar10 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
                }
              }
              bVar8 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                      operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *
                                 )local_4d8,&name,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 ((long)&ppVar4[uVar14 * 0xf].first._M_len +
                                 (ulong)(uint)(iVar6 << 5)));
              if (bVar8) goto LAB_00687189;
              uVar10 = uVar10 - 1 & uVar10;
            } while (uVar10 != 0);
            bVar9 = pgVar3[uVar14].m[0xf].n;
            uVar11 = local_490;
            uVar14 = local_498;
            uVar13 = local_4a0;
            hash = local_4a8;
            pos0 = local_4b0;
            uVar17 = local_458;
            uVar18 = uStack_457;
            uVar19 = uStack_456;
            bVar20 = bStack_455;
            uVar21 = uStack_454;
            uVar22 = uStack_453;
            uVar23 = uStack_452;
            bVar24 = bStack_451;
            uVar25 = uStack_450;
            uVar26 = uStack_44f;
            uVar27 = uStack_44e;
            bVar28 = bStack_44d;
            uVar29 = uStack_44c;
            uVar30 = uStack_44b;
            uVar31 = uStack_44a;
            bVar32 = bStack_449;
          }
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[uVar11] & bVar9) == 0) break;
          uVar5 = (this->macros).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                  .arrays.groups_size_mask;
          lVar12 = uVar14 + uVar13;
          uVar13 = uVar13 + 1;
          uVar14 = lVar12 + 1U & uVar5;
        } while (uVar13 <= uVar5);
        if ((this->macros).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
            .size_ctrl.size <
            (this->macros).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
            .size_ctrl.ml) {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
          ::
          nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::syntax::DefineDirectiveSyntax_const*&>
                    (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
                           *)local_4d8,(arrays_type *)local_4d8,pos0,hash,&local_4d9,&name,&define);
          psVar1 = &(this->macros).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::Preprocessor::MacroDef>_>_>
                    .size_ctrl.size;
          *psVar1 = *psVar1 + 1;
        }
        else {
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
          ::
          unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::syntax::DefineDirectiveSyntax_const*&>
                    (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::Preprocessor::MacroDef>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::Preprocessor::MacroDef>>>
                           *)local_4d8,hash,&local_4d9,&name,&define);
        }
      }
LAB_00687189:
      inheritedMacros._M_ptr = inheritedMacros._M_ptr + 1;
    } while (inheritedMacros._M_ptr != ppDVar15);
  }
  memcpy((iterator)&res,&DAT_00ca0d58,0x400);
  il._M_len = 0x20;
  il._M_array = (iterator)&res;
  boost::unordered::
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&),_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_void_(slang::parsing::Preprocessor::*)(slang::parsing::Token,_const_slang::syntax::PragmaExpressionSyntax_*,_slang::SmallVectorBase<slang::parsing::Token>_&)>_>_>
  ::operator=(&this->pragmaProtectHandlers,il);
  return;
}

Assistant:

Preprocessor::Preprocessor(SourceManager& sourceManager, BumpAllocator& alloc,
                           Diagnostics& diagnostics, const Bag& options_,
                           std::span<const DefineDirectiveSyntax* const> inheritedMacros) :
    sourceManager(sourceManager), alloc(alloc), diagnostics(diagnostics),
    options(options_.getOrDefault<PreprocessorOptions>()),
    lexerOptions(options_.getOrDefault<LexerOptions>()),
    numberParser(diagnostics, alloc, options.languageVersion) {

    keywordVersionStack.push_back(LF::getDefaultKeywordVersion(options.languageVersion));
    resetAllDirectives();
    undefineAll();

    // Add in any inherited macros that aren't already set in our map.
    for (auto define : inheritedMacros) {
        auto name = define->name.valueText();
        if (!name.empty())
            macros.emplace(name, define);
    }

    // clang-format off
    pragmaProtectHandlers = {
        { "begin", &Preprocessor::handleProtectBegin },
        { "end", &Preprocessor::handleProtectEnd },
        { "begin_protected", &Preprocessor::handleProtectBeginProtected },
        { "end_protected", &Preprocessor::handleProtectEndProtected },
        { "author", &Preprocessor::handleProtectSingleArgIgnore },
        { "author_info", &Preprocessor::handleProtectSingleArgIgnore },
        { "encrypt_agent", &Preprocessor::handleProtectSingleArgIgnore },
        { "encrypt_agent_info", &Preprocessor::handleProtectSingleArgIgnore },
        { "encoding", &Preprocessor::handleProtectEncoding },
        { "data_keyowner", &Preprocessor::handleProtectSingleArgIgnore },
        { "data_method", &Preprocessor::handleProtectSingleArgIgnore },
        { "data_keyname", &Preprocessor::handleProtectSingleArgIgnore },
        { "data_public_key", &Preprocessor::handleProtectKey },
        { "data_decrypt_key", &Preprocessor::handleProtectKey },
        { "data_block", &Preprocessor::handleProtectBlock },
        { "digest_keyowner", &Preprocessor::handleProtectSingleArgIgnore },
        { "digest_key_method", &Preprocessor::handleProtectSingleArgIgnore },
        { "digest_keyname", &Preprocessor::handleProtectSingleArgIgnore },
        { "digest_public_key", &Preprocessor::handleProtectKey },
        { "digest_decrypt_key", &Preprocessor::handleProtectKey },
        { "digest_method", &Preprocessor::handleProtectSingleArgIgnore },
        { "digest_block", &Preprocessor::handleProtectBlock },
        { "key_keyowner", &Preprocessor::handleProtectSingleArgIgnore },
        { "key_method", &Preprocessor::handleProtectSingleArgIgnore },
        { "key_keyname", &Preprocessor::handleProtectSingleArgIgnore },
        { "key_public_key", &Preprocessor::handleProtectKey },
        { "key_block", &Preprocessor::handleProtectBlock },
        { "decrypt_license", &Preprocessor::handleProtectLicense },
        { "runtime_license", &Preprocessor::handleProtectLicense },
        { "comment", &Preprocessor::handleProtectSingleArgIgnore },
        { "reset", &Preprocessor::handleProtectReset },
        { "viewport", &Preprocessor::handleProtectViewport }
    };
    // clang-format on
}